

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O1

mat4 * rengine::TransformNode::matrixFor(mat4 *__return_storage_ptr__,Node *descendant,Node *root)

{
  mat4 o;
  long lVar1;
  mat4 *pmVar2;
  float *pfVar3;
  undefined8 *puVar4;
  byte bVar5;
  float in_stack_fffffffffffffef8 [16];
  mat4 local_bc;
  float local_78 [16];
  uint local_38;
  
  bVar5 = 0;
  __return_storage_ptr__->m[0xc] = 0.0;
  __return_storage_ptr__->m[0xd] = 0.0;
  __return_storage_ptr__->m[0xe] = 0.0;
  __return_storage_ptr__->m[0xf] = 1.0;
  __return_storage_ptr__->m[8] = 0.0;
  __return_storage_ptr__->m[9] = 0.0;
  __return_storage_ptr__->m[10] = 1.0;
  __return_storage_ptr__->m[0xb] = 0.0;
  __return_storage_ptr__->m[4] = 0.0;
  __return_storage_ptr__->m[5] = 1.0;
  __return_storage_ptr__->m[6] = 0.0;
  __return_storage_ptr__->m[7] = 0.0;
  __return_storage_ptr__->m[0] = 1.0;
  __return_storage_ptr__->m[1] = 0.0;
  __return_storage_ptr__->m[2] = 0.0;
  __return_storage_ptr__->m[3] = 0.0;
  __return_storage_ptr__->type = 0;
  while( true ) {
    if ((descendant != (Node *)0x0) && (descendant->field_0x30 == '\x01')) {
      pfVar3 = (float *)&descendant->field_0x34;
      pmVar2 = &local_bc;
      for (lVar1 = 0x11; lVar1 != 0; lVar1 = lVar1 + -1) {
        pmVar2->m[0] = *pfVar3;
        pfVar3 = pfVar3 + (ulong)bVar5 * -2 + 1;
        pmVar2 = (mat4 *)((long)pmVar2 + (ulong)bVar5 * -8 + 4);
      }
      pmVar2 = __return_storage_ptr__;
      pfVar3 = local_78;
      for (lVar1 = 0x11; lVar1 != 0; lVar1 = lVar1 + -1) {
        *pfVar3 = pmVar2->m[0];
        pmVar2 = (mat4 *)((long)pmVar2 + (ulong)bVar5 * -8 + 4);
        pfVar3 = pfVar3 + (ulong)bVar5 * -2 + 1;
      }
      pfVar3 = local_78;
      puVar4 = (undefined8 *)&stack0xfffffffffffffef8;
      for (lVar1 = 8; lVar1 != 0; lVar1 = lVar1 + -1) {
        *puVar4 = *(undefined8 *)pfVar3;
        pfVar3 = pfVar3 + ((ulong)bVar5 * -2 + 1) * 2;
        puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
      }
      o.type = local_38;
      o.m[0] = in_stack_fffffffffffffef8[0];
      o.m[1] = in_stack_fffffffffffffef8[1];
      o.m[2] = in_stack_fffffffffffffef8[2];
      o.m[3] = in_stack_fffffffffffffef8[3];
      o.m[4] = in_stack_fffffffffffffef8[4];
      o.m[5] = in_stack_fffffffffffffef8[5];
      o.m[6] = in_stack_fffffffffffffef8[6];
      o.m[7] = in_stack_fffffffffffffef8[7];
      o.m[8] = in_stack_fffffffffffffef8[8];
      o.m[9] = in_stack_fffffffffffffef8[9];
      o.m[10] = in_stack_fffffffffffffef8[10];
      o.m[0xb] = in_stack_fffffffffffffef8[0xb];
      o.m[0xc] = in_stack_fffffffffffffef8[0xc];
      o.m[0xd] = in_stack_fffffffffffffef8[0xd];
      o.m[0xe] = in_stack_fffffffffffffef8[0xe];
      o.m[0xf] = in_stack_fffffffffffffef8[0xf];
      mat4::operator*(__return_storage_ptr__,&local_bc,o);
    }
    if (descendant == root) break;
    descendant = descendant->m_parent;
    if (descendant == (Node *)0x0 && root != (Node *)0x0) {
      __assert_fail("root == nullptr || n != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/node.h"
                    ,0x188,"static mat4 rengine::TransformNode::matrixFor(Node *, Node *)");
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static mat4 matrixFor(Node *descendant, Node *root = 0) {
        Node *n = descendant;
        mat4 m;
        while (true) {
            if (TransformNode *tn = TransformNode::from(n)) {
                m = tn->matrix() * m;
            }
            if (n == root)
                break;
            n = n->parent();
            assert(root == nullptr || n != nullptr);
        }
        return m;
    }